

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool op_smlald(DisasContext_conflict1 *s,arg_rrrr *a,_Bool m_swap,_Bool sub)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar4;
  TCGContext_conflict1 *s_01;
  TCGTemp *pTVar5;
  TCGTemp *pTVar6;
  uintptr_t o_2;
  TCGv_i64 ret;
  uintptr_t o;
  TCGv_i32 pTVar7;
  uintptr_t o_1;
  TCGv_i32 var;
  TCGv_i64 ret_00;
  TCGContext_conflict1 *tcg_ctx;
  
  uVar3 = s->features;
  if ((uVar3 & 8) != 0) {
    s_00 = s->uc->tcg_ctx;
    iVar1 = a->rn;
    pTVar5 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    pTVar7 = (TCGv_i32)((long)pTVar5 - (long)s_00);
    load_reg_var(s,pTVar7,iVar1);
    iVar1 = a->rm;
    pTVar4 = s->uc->tcg_ctx;
    pTVar5 = tcg_temp_new_internal_aarch64(pTVar4,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar5 - (long)pTVar4);
    load_reg_var(s,var,iVar1);
    if (m_swap) {
      tcg_gen_rotri_i32_aarch64(s_00,var,var,0x10);
    }
    gen_smul_dual(s_00,pTVar7,var);
    pTVar5 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    ret_00 = (TCGv_i64)((long)pTVar5 - (long)s_00);
    pTVar6 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)pTVar6 - (long)s_00);
    tcg_gen_ext_i32_i64_aarch64(s_00,ret_00,pTVar7);
    tcg_gen_ext_i32_i64_aarch64(s_00,ret,var);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar7 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var + (long)s_00));
    if (sub) {
      tcg_gen_sub_i64(s_00,ret_00,ret_00,ret);
    }
    else {
      tcg_gen_op3_aarch64(s_00,INDEX_op_add_i64,(TCGArg)pTVar5,(TCGArg)pTVar5,(TCGArg)pTVar6);
    }
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
    iVar1 = a->ra;
    iVar2 = a->rd;
    pTVar4 = s->uc->tcg_ctx;
    pTVar5 = tcg_temp_new_internal_aarch64(pTVar4,TCG_TYPE_I32,false);
    load_reg_var(s,(TCGv_i32)((long)pTVar5 - (long)pTVar4),iVar1);
    s_01 = s->uc->tcg_ctx;
    pTVar6 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
    pTVar7 = (TCGv_i32)((long)pTVar6 - (long)s_01);
    load_reg_var(s,pTVar7,iVar2);
    pTVar6 = tcg_temp_new_internal_aarch64(pTVar4,TCG_TYPE_I64,false);
    tcg_gen_concat_i32_i64_aarch64
              (pTVar4,(TCGv_i64)((long)pTVar6 - (long)pTVar4),
               (TCGv_i32)((long)pTVar5 - (long)pTVar4),pTVar7);
    tcg_temp_free_internal_aarch64(pTVar4,pTVar5);
    tcg_temp_free_internal_aarch64(pTVar4,(TCGTemp *)(pTVar7 + (long)pTVar4));
    tcg_gen_op3_aarch64(pTVar4,INDEX_op_add_i64,(TCGArg)(ret_00 + (long)pTVar4),
                        (TCGArg)(ret_00 + (long)pTVar4),(TCGArg)pTVar6);
    tcg_temp_free_internal_aarch64(pTVar4,pTVar6);
    iVar1 = a->ra;
    iVar2 = a->rd;
    pTVar4 = s->uc->tcg_ctx;
    pTVar5 = tcg_temp_new_internal_aarch64(pTVar4,TCG_TYPE_I32,false);
    tcg_gen_extrl_i64_i32_aarch64(pTVar4,(TCGv_i32)((long)pTVar5 - (long)pTVar4),ret_00);
    store_reg(s,iVar1,(TCGv_i32)((long)pTVar5 - (long)pTVar4));
    pTVar5 = tcg_temp_new_internal_aarch64(pTVar4,TCG_TYPE_I32,false);
    tcg_gen_extrh_i64_i32_aarch64(pTVar4,(TCGv_i32)((long)pTVar5 - (long)pTVar4),ret_00);
    store_reg(s,iVar2,(TCGv_i32)((long)pTVar5 - (long)pTVar4));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret_00 + (long)s_00));
  }
  return SUB41(((uint)uVar3 & 8) >> 3,0);
}

Assistant:

static bool op_smlald(DisasContext *s, arg_rrrr *a, bool m_swap, bool sub)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;
    TCGv_i64 l1, l2;

    if (!ENABLE_ARCH_6) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    if (m_swap) {
        gen_swap_half(tcg_ctx, t2);
    }
    gen_smul_dual(tcg_ctx, t1, t2);

    l1 = tcg_temp_new_i64(tcg_ctx);
    l2 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_ext_i32_i64(tcg_ctx, l1, t1);
    tcg_gen_ext_i32_i64(tcg_ctx, l2, t2);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t2);

    if (sub) {
        tcg_gen_sub_i64(tcg_ctx, l1, l1, l2);
    } else {
        tcg_gen_add_i64(tcg_ctx, l1, l1, l2);
    }
    tcg_temp_free_i64(tcg_ctx, l2);

    gen_addq(s, l1, a->ra, a->rd);
    gen_storeq_reg(s, a->ra, a->rd, l1);
    tcg_temp_free_i64(tcg_ctx, l1);
    return true;
}